

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O0

void ut11::Assert::That<std::__cxx11::string,ut11::Operands::EqualTo<char[109]>>
               (size_t line,string *file,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
               EqualTo<char[109]> *operand)

{
  string *line_00;
  bool bVar1;
  EqualTo<char[109]> local_68 [4];
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  EqualTo<char[109]> *operand_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_local;
  string *file_local;
  size_t line_local;
  
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operand;
  operand_local = (EqualTo<char[109]> *)expected;
  expected_local = file;
  file_local = (string *)line;
  bVar1 = Operands::EqualTo<char[109]>::operator()(operand,expected);
  line_00 = file_local;
  if (!bVar1) {
    std::__cxx11::string::string(local_48,(string *)file);
    Operands::EqualTo<char[109]>::GetErrorMessage<std::__cxx11::string>(local_68,local_28);
    Fail((size_t)line_00,(string *)local_48,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}